

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mqtt_message.c
# Opt level: O0

int mqttmessage_getTopicLevels(MQTT_MESSAGE_HANDLE handle,char ***levels,size_t *count)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  size_t length;
  char *local_68;
  LOGGER_LOG l_2;
  char *delimiters [1];
  LOGGER_LOG l_1;
  char *topic_name;
  MQTT_MESSAGE *msgInfo;
  LOGGER_LOG l;
  int result;
  size_t *count_local;
  char ***levels_local;
  MQTT_MESSAGE_HANDLE handle_local;
  
  if (((handle == (MQTT_MESSAGE_HANDLE)0x0) || (levels == (char ***)0x0)) ||
     (count == (size_t *)0x0)) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/umqtt/src/mqtt_message.c"
                ,"mqttmessage_getTopicLevels",0xe0,1,
                "Invalid Parameter handle: %p, levels: %p, count: %p",handle,levels,count);
    }
    l._4_4_ = 0xe1;
  }
  else {
    if (handle->topicName == (char *)0x0) {
      local_68 = handle->const_topic_name;
    }
    else {
      local_68 = handle->topicName;
    }
    if (local_68 == (char *)0x0) {
      delimiters[0] = (char *)xlogging_get_log_function();
      if ((LOGGER_LOG)delimiters[0] != (LOGGER_LOG)0x0) {
        (*(code *)delimiters[0])
                  (AZ_LOG_ERROR,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/umqtt/src/mqtt_message.c"
                   ,"mqttmessage_getTopicLevels",0xeb,1,"Topic name is NULL");
      }
      l._4_4_ = 0xec;
    }
    else {
      l_2 = (LOGGER_LOG)0x1d3484;
      length = strlen(local_68);
      iVar1 = StringToken_Split(local_68,length,(char **)&l_2,1,false,levels,count);
      if (iVar1 == 0) {
        l._4_4_ = 0;
      }
      else {
        p_Var2 = xlogging_get_log_function();
        if (p_Var2 != (LOGGER_LOG)0x0) {
          (*p_Var2)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/umqtt/src/mqtt_message.c"
                    ,"mqttmessage_getTopicLevels",0xf9,1,"Failed splitting topic levels");
        }
        l._4_4_ = 0xfa;
      }
    }
  }
  return l._4_4_;
}

Assistant:

int mqttmessage_getTopicLevels(MQTT_MESSAGE_HANDLE handle, char*** levels, size_t* count)
{
    int result;

    // Codes_SRS_MQTTMESSAGE_09_001: [ If `handle`, `levels` or `count` are NULL the function shall return a non-zero value. ]
    if (handle == NULL || levels == NULL || count == NULL)
    {
        LogError("Invalid Parameter handle: %p, levels: %p, count: %p", handle, levels, count);
        result = MU_FAILURE;
    }
    else
    {
        MQTT_MESSAGE* msgInfo = (MQTT_MESSAGE*)handle;

        const char* topic_name = msgInfo->topicName != NULL ? msgInfo->topicName : msgInfo->const_topic_name;

        if (topic_name == NULL)
        {
            LogError("Topic name is NULL");
            result = MU_FAILURE;
        }
        else
        {
            const char* delimiters[1];

            delimiters[0] = "/";

            // Codes_SRS_MQTTMESSAGE_09_002: [ The topic name, excluding the property bag, shall be split into individual tokens using "/" as separator ]
            // Codes_SRS_MQTTMESSAGE_09_004: [ The split tokens shall be stored in `levels` and its count in `count` ]
            if (StringToken_Split(topic_name, strlen(topic_name), delimiters, 1, false, levels, count) != 0)
            {
                // Codes_SRS_MQTTMESSAGE_09_003: [ If splitting fails the function shall return a non-zero value. ]
                LogError("Failed splitting topic levels");
                result = MU_FAILURE;
            }
            else
            {
                // Codes_SRS_MQTTMESSAGE_09_005: [ If no failures occur the function shall return zero. ]
                result = 0;
            }
        }
    }

    return result;
}